

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pybind11.h
# Opt level: O0

void __thiscall
pybind11::detail::generic_type::def_property_static_impl
          (generic_type *this,char *name,handle fget,handle fset,function_record *rec_func)

{
  PyObject *pPVar1;
  PyObject *pPVar2;
  internals *piVar3;
  PyObject **ppPVar4;
  object_api<pybind11::handle> *in_RDI;
  long in_R8;
  handle property;
  bool has_doc;
  bool is_static;
  PyTypeObject *ptr;
  undefined6 in_stack_ffffffffffffff40;
  undefined1 uVar5;
  undefined1 in_stack_ffffffffffffff47;
  undefined7 in_stack_ffffffffffffff50;
  byte bVar6;
  str *in_stack_ffffffffffffff58;
  none *in_stack_ffffffffffffff60;
  handle *in_stack_ffffffffffffff68;
  handle *in_stack_ffffffffffffff70;
  object_api<pybind11::handle> *in_stack_ffffffffffffff78;
  handle local_38;
  undefined1 local_2a;
  byte local_29;
  long local_28;
  handle local_10;
  handle local_8;
  
  bVar6 = 0;
  local_28 = in_R8;
  if (in_R8 != 0) {
    in_stack_ffffffffffffff47 = false;
    if ((*(ushort *)(in_R8 + 0x59) >> 4 & 1) != 0) {
      in_stack_ffffffffffffff47 = pybind11::handle::operator_cast_to_bool((handle *)(in_R8 + 0x70));
    }
    bVar6 = in_stack_ffffffffffffff47 ^ 0xff;
  }
  local_29 = bVar6 & 1;
  uVar5 = false;
  if ((local_28 != 0) && (uVar5 = false, *(long *)(local_28 + 8) != 0)) {
    uVar5 = options::show_user_defined_docstrings();
  }
  local_2a = uVar5;
  if ((local_29 & 1) == 0) {
    ptr = (PyTypeObject *)&PyProperty_Type;
  }
  else {
    piVar3 = get_internals();
    ptr = piVar3->static_property_type;
  }
  pybind11::handle::handle(&local_38,(PyObject *)ptr);
  ppPVar4 = pybind11::handle::ptr(&local_8);
  pPVar1 = *ppPVar4;
  if (pPVar1 == (PyObject *)0x0) {
    none::none((none *)CONCAT17(in_stack_ffffffffffffff47,CONCAT16(uVar5,in_stack_ffffffffffffff40))
              );
  }
  ppPVar4 = pybind11::handle::ptr(&local_10);
  pPVar2 = *ppPVar4;
  if (pPVar2 == (PyObject *)0x0) {
    none::none((none *)CONCAT17(in_stack_ffffffffffffff47,CONCAT16(uVar5,in_stack_ffffffffffffff40))
              );
  }
  none::none((none *)CONCAT17(in_stack_ffffffffffffff47,CONCAT16(uVar5,in_stack_ffffffffffffff40)));
  str::str((str *)CONCAT17(bVar6,in_stack_ffffffffffffff50),(char *)in_RDI);
  object_api<pybind11::handle>::operator()
            (in_stack_ffffffffffffff78,in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,
             in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
  object_api<pybind11::handle>::attr
            (in_RDI,(char *)CONCAT17(in_stack_ffffffffffffff47,
                                     CONCAT16(uVar5,in_stack_ffffffffffffff40)));
  accessor<pybind11::detail::accessor_policies::str_attr>::operator=
            ((accessor<pybind11::detail::accessor_policies::str_attr> *)
             CONCAT17(in_stack_ffffffffffffff47,CONCAT16(uVar5,in_stack_ffffffffffffff40)),
             (object *)ptr);
  accessor<pybind11::detail::accessor_policies::str_attr>::~accessor
            ((accessor<pybind11::detail::accessor_policies::str_attr> *)0x3aa88a);
  object::~object((object *)0x3aa897);
  str::~str((str *)0x3aa8a1);
  none::~none((none *)0x3aa8ab);
  if (pPVar2 == (PyObject *)0x0) {
    none::~none((none *)0x3aa8be);
  }
  if (pPVar1 == (PyObject *)0x0) {
    none::~none((none *)0x3aa8d7);
  }
  return;
}

Assistant:

void def_property_static_impl(const char *name,
                                  handle fget, handle fset,
                                  detail::function_record *rec_func) {
        const auto is_static = rec_func && !(rec_func->is_method && rec_func->scope);
        const auto has_doc = rec_func && rec_func->doc && pybind11::options::show_user_defined_docstrings();
        auto property = handle((PyObject *) (is_static ? get_internals().static_property_type
                                                       : &PyProperty_Type));
        attr(name) = property(fget.ptr() ? fget : none(),
                              fset.ptr() ? fset : none(),
                              /*deleter*/none(),
                              pybind11::str(has_doc ? rec_func->doc : ""));
    }